

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O3

int CfdGetTxOutCount(void *handle,int net_type,char *tx_hex_string,uint32_t *count)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *this;
  bool is_bitcoin;
  TransactionContext tx;
  allocator local_10a;
  bool local_109;
  string local_108;
  ConfidentialTransactionContext local_e8;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(tx_hex_string);
  if (!bVar1) {
    local_109 = false;
    cfd::capi::ConvertNetType(net_type,&local_109);
    if (local_109 == true) {
      std::__cxx11::string::string((string *)&local_108,tx_hex_string,&local_10a);
      cfd::TransactionContext::TransactionContext((TransactionContext *)&local_e8,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      if (count != (uint32_t *)0x0) {
        uVar2 = cfd::core::Transaction::GetTxOutCount((Transaction *)&local_e8);
        *count = uVar2;
      }
      cfd::TransactionContext::~TransactionContext((TransactionContext *)&local_e8);
    }
    else {
      std::__cxx11::string::string((string *)&local_108,tx_hex_string,&local_10a);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&local_e8,&local_108);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      if (count != (uint32_t *)0x0) {
        uVar2 = cfd::core::ConfidentialTransaction::GetTxOutCount
                          (&local_e8.super_ConfidentialTransaction);
        *count = uVar2;
      }
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_e8);
    }
    return 0;
  }
  local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)0x5e44da;
  local_e8.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0xaa8;
  local_e8.super_ConfidentialTransaction.vin_.
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x5e4937;
  cfd::core::logger::log<>
            ((CfdSourceLocation *)&local_e8,kCfdLogLevelWarning,"tx is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_e8.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)&local_e8.super_ConfidentialTransaction.vin_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e8,"Failed to parameter. tx is null or empty.","");
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&local_e8);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxOutCount(
    void* handle, int net_type, const char* tx_hex_string, uint32_t* count) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      if (count != nullptr) *count = tx.GetTxOutCount();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      if (count != nullptr) *count = tx.GetTxOutCount();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}